

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseEqn.c
# Opt level: O3

Hop_Obj_t *
Parse_FormulaParserEqn(FILE *pOutput,char *pFormInit,Vec_Ptr_t *vVarNames,Hop_Man_t *pMan)

{
  char cVar1;
  void **ppvVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  byte *__s;
  Parse_StackFn_t *p;
  Parse_StackOp_t *p_00;
  size_t sVar8;
  Hop_Obj_t *pHVar9;
  void *pvVar10;
  long lVar11;
  char *pcVar12;
  byte *__s1;
  long lVar13;
  bool bVar14;
  
  iVar6 = 0;
  pcVar12 = pFormInit;
  do {
    cVar1 = *pcVar12;
    if (cVar1 == '(') {
      iVar6 = iVar6 + 1;
    }
    else if (cVar1 == ')') {
      iVar6 = iVar6 + -1;
    }
    else if (cVar1 == '\0') break;
    pcVar12 = pcVar12 + 1;
  } while( true );
  if (iVar6 != 0) {
    fwrite("Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n",
           0x52,1,(FILE *)pOutput);
    return (Hop_Obj_t *)0x0;
  }
  sVar7 = strlen(pFormInit);
  __s = (byte *)malloc(sVar7 + 3);
  sprintf((char *)__s,"(%s)",pFormInit);
  p = Parse_StackFnStart(1000);
  p_00 = Parse_StackOpStart(1000);
  iVar6 = 1;
  __s1 = __s;
LAB_0044fa07:
  bVar3 = *__s1;
  if (bVar3 < 0x20) {
    if ((bVar3 - 9 < 2) || (bVar3 == 0xd)) goto switchD_0044fa28_caseD_20;
    if (bVar3 != 0) goto switchD_0044fa28_caseD_22;
    iVar6 = Parse_StackFnIsEmpty(p);
    if (iVar6 == 0) {
      pHVar9 = (Hop_Obj_t *)Parse_StackFnPop(p);
      iVar6 = Parse_StackFnIsEmpty(p);
      if (iVar6 == 0) {
        pcVar12 = "Parse_FormulaParserEqn(): Something is left in the function stack\n";
        sVar7 = 0x42;
      }
      else {
        iVar6 = Parse_StackOpIsEmpty(p_00);
        if (iVar6 != 0) {
          Parse_StackFnFree(p);
          Parse_StackOpFree(p_00);
          if (__s != (byte *)0x0) {
            free(__s);
            return pHVar9;
          }
          return pHVar9;
        }
        pcVar12 = "Parse_FormulaParserEqn(): Something is left in the operation stack\n";
        sVar7 = 0x43;
      }
    }
    else {
      pcVar12 = "Parse_FormulaParserEqn(): The input string is empty\n";
      sVar7 = 0x34;
    }
    goto LAB_0044fe64;
  }
  switch(bVar3) {
  case 0x20:
    goto switchD_0044fa28_caseD_20;
  case 0x21:
    if (iVar6 == 2) {
      Parse_StackOpPush(p_00,9);
      iVar6 = 10;
      goto LAB_0044fafe;
    }
    Parse_StackOpPush(p_00,10);
    if (iVar6 == 1) {
      iVar6 = 1;
      goto switchD_0044fa28_caseD_20;
    }
    goto LAB_0044fb0c;
  default:
switchD_0044fa28_caseD_22:
    lVar11 = -0x100000000;
    sVar7 = 0;
    do {
      if (bVar3 < 0x2c) {
        if ((0xe0100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0) {
          bVar14 = iVar6 == 2;
          goto LAB_0044fc04;
        }
        if ((0x10200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0) goto LAB_0044fd41;
      }
      bVar3 = __s1[sVar7 + 1];
      sVar7 = sVar7 + 1;
      lVar11 = lVar11 + 0x100000000;
    } while( true );
  case 0x28:
    iVar5 = 1;
    bVar14 = iVar6 != 2;
    iVar6 = 1;
    if (bVar14) goto LAB_0044fd26;
    pcVar12 = 
    "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n";
    sVar7 = 0x57;
    goto LAB_0044fe64;
  case 0x29:
    iVar6 = Parse_StackOpIsEmpty(p_00);
    if (iVar6 == 0) {
      while( true ) {
        iVar6 = Parse_StackOpIsEmpty(p_00);
        if (iVar6 != 0) goto LAB_0044fd8d;
        iVar6 = Parse_StackOpPop(p_00);
        if (iVar6 == 1) break;
        pHVar9 = Parse_ParserPerformTopOp(pMan,p,iVar6);
        if (pHVar9 == (Hop_Obj_t *)0x0) {
          Parse_StackFnFree(p);
          Parse_StackOpFree(p_00);
          fwrite("Parse_FormulaParserEqn(): Unknown operation\n",0x2c,1,(FILE *)pOutput);
          goto joined_r0x0044fe10;
        }
      }
      break;
    }
LAB_0044fd8d:
    pcVar12 = "Parse_FormulaParserEqn(): There is no opening parenthesis\n";
    sVar7 = 0x3a;
    goto LAB_0044fe64;
  case 0x2a:
  case 0x2b:
    if (iVar6 == 2) {
      iVar6 = (uint)(bVar3 == 0x2a) * 2 + 7;
LAB_0044fafe:
      Parse_StackOpPush(p_00,iVar6);
      iVar6 = 3;
LAB_0044fb0c:
      while( true ) {
        iVar5 = Parse_StackOpPop(p_00);
        iVar4 = Parse_StackOpIsEmpty(p_00);
        if (iVar4 != 0) break;
        iVar4 = Parse_StackOpPop(p_00);
        if (iVar4 < iVar5) {
          Parse_StackOpPush(p_00,iVar4);
          break;
        }
        pHVar9 = Parse_ParserPerformTopOp(pMan,p,iVar4);
        if (pHVar9 == (Hop_Obj_t *)0x0) {
          fwrite("Parse_FormulaParserEqn(): Unknown operation\n",0x2c,1,(FILE *)pOutput);
          if (__s != (byte *)0x0) {
            free(__s);
          }
          Parse_StackFnFree(p);
          Parse_StackOpFree(p_00);
          return (Hop_Obj_t *)0x0;
        }
        Parse_StackOpPush(p_00,iVar5);
      }
LAB_0044fd26:
      Parse_StackOpPush(p_00,iVar5);
      goto switchD_0044fa28_caseD_20;
    }
    pcVar12 = "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n";
    sVar7 = 0x48;
    goto LAB_0044fe64;
  case 0x30:
    Parse_StackFnPush(p,(void *)((ulong)pMan->pConst1 ^ 1));
    if (iVar6 == 2) {
      pcVar12 = "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n";
      goto LAB_0044fe32;
    }
    break;
  case 0x31:
    Parse_StackFnPush(p,pMan->pConst1);
    if (iVar6 == 2) {
      pcVar12 = "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n";
LAB_0044fe32:
      sVar7 = 0x41;
LAB_0044fe64:
      fwrite(pcVar12,sVar7,1,(FILE *)pOutput);
joined_r0x0044fe10:
      if (__s != (byte *)0x0) {
        free(__s);
      }
      return (Hop_Obj_t *)0x0;
    }
  }
LAB_0044fcce:
  iVar5 = Parse_StackOpIsEmpty(p_00);
  iVar6 = 2;
  if (iVar5 == 0) {
    do {
      iVar5 = Parse_StackOpPop(p_00);
      if (iVar5 != 10) {
        iVar6 = 2;
        goto LAB_0044fd26;
      }
      pvVar10 = Parse_StackFnPop(p);
      Parse_StackFnPush(p,(void *)((ulong)pvVar10 ^ 1));
      iVar6 = Parse_StackOpIsEmpty(p_00);
    } while (iVar6 == 0);
    iVar6 = 2;
  }
switchD_0044fa28_caseD_20:
  __s1 = __s1 + 1;
  goto LAB_0044fa07;
LAB_0044fd41:
  fwrite("Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n"
         ,0x60,1,(FILE *)pOutput);
  bVar14 = false;
LAB_0044fc04:
  iVar6 = vVarNames->nSize;
  if ((long)iVar6 < 1) {
LAB_0044fd72:
    fprintf((FILE *)pOutput,
            "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n",
            __s1);
    goto joined_r0x0044fe10;
  }
  ppvVar2 = vVarNames->pArray;
  lVar13 = 0;
  while( true ) {
    pcVar12 = (char *)ppvVar2[lVar13];
    iVar5 = strncmp((char *)__s1,pcVar12,sVar7);
    if ((iVar5 == 0) && (sVar8 = strlen(pcVar12), sVar8 == sVar7)) break;
    lVar13 = lVar13 + 1;
    if (iVar6 == lVar13) goto LAB_0044fd72;
  }
  __s1 = __s1 + (lVar11 >> 0x20);
  if (bVar14) {
    fprintf((FILE *)pOutput,
            "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n"
            ,__s1);
    goto joined_r0x0044fe10;
  }
  pHVar9 = Hop_IthVar(pMan,(int)lVar13);
  Parse_StackFnPush(p,pHVar9);
  goto LAB_0044fcce;
}

Assistant:

Hop_Obj_t * Parse_FormulaParserEqn( FILE * pOutput, char * pFormInit, Vec_Ptr_t * vVarNames, Hop_Man_t * pMan )
{
    char * pFormula;
    Parse_StackFn_t * pStackFn;
    Parse_StackOp_t * pStackOp;
    Hop_Obj_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
	int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( pOutput, "Parse_FormulaParserEqn(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Parse_StackFnStart( PARSE_EQN_STACKSIZE );
    pStackOp = Parse_StackOpStart( PARSE_EQN_STACKSIZE );

    Flag = PARSE_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
	{
		switch ( *pTemp )
	    {
		// skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
			continue;
		case PARSE_EQN_SYM_CONST0:
		    Parse_StackFnPush( pStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( b0 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 0.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_CONST1:
		    Parse_StackFnPush( pStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( b1 );
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): No operation symbol before constant 1.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
		case PARSE_EQN_SYM_NEG:
			if ( Flag == PARSE_EQN_FLAG_VAR )
			{// if NEGBEF follows a variable, AND is assumed
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				Flag = PARSE_EQN_FLAG_OPER;
			}
    		Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_NEG );
			break;
        case PARSE_EQN_SYM_AND:
        case PARSE_EQN_SYM_OR:
			if ( Flag != PARSE_EQN_FLAG_VAR )
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no variable before AND, EXOR, or OR.\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( *pTemp == PARSE_EQN_SYM_AND )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
			else //if ( *pTemp == PARSE_EQN_SYM_OR )
				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_OR );
			Flag = PARSE_EQN_FLAG_OPER; 
            break;
		case PARSE_EQN_SYM_OPEN:
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
//				Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_AND );
				fprintf( pOutput, "Parse_FormulaParserEqn(): An opening parenthesis follows a var without operation sign.\n" ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackOpPush( pStackOp, PARSE_EQN_OPER_MARK );
			// after an opening bracket, it feels like starting over again
			Flag = PARSE_EQN_FLAG_START; 
            break;
		case PARSE_EQN_SYM_CLOSE:
			if ( !Parse_StackOpIsEmpty( pStackOp ) )
            {
				while ( 1 )
			    {
				    if ( Parse_StackOpIsEmpty( pStackOp ) )
					{
						fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
						Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
					}
					Oper = Parse_StackOpPop( pStackOp );
					if ( Oper == PARSE_EQN_OPER_MARK )
						break;

                    // perform the given operation
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper ) == NULL )
	                {
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
		                return NULL;
	                }
			    }
            }
		    else
			{
				fprintf( pOutput, "Parse_FormulaParserEqn(): There is no opening parenthesis\n" );
				Flag = PARSE_EQN_FLAG_ERROR; 
                break;
			}
			if ( Flag != PARSE_EQN_FLAG_ERROR )
			    Flag = PARSE_EQN_FLAG_VAR; 
			break;


		default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != PARSE_EQN_SYM_AND && pTemp[i] != PARSE_EQN_SYM_OR && pTemp[i] != PARSE_EQN_SYM_CLOSE; i++ )
              {
				    if ( pTemp[i] == PARSE_EQN_SYM_NEG || pTemp[i] == PARSE_EQN_SYM_OPEN )
				    {
					    fprintf( pOutput, "Parse_FormulaParserEqn(): The negation sign or an opening parenthesis inside the variable name.\n" );
					    Flag = PARSE_EQN_FLAG_ERROR; 
                        break;
				    }
              }
            // variable name is found
            fFound = 0;
            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            if ( !fFound )
			{ 
				fprintf( pOutput, "Parse_FormulaParserEqn(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
			}
			if ( Flag == PARSE_EQN_FLAG_VAR )
            {
				fprintf( pOutput, "Parse_FormulaParserEqn(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
				Flag = PARSE_EQN_FLAG_ERROR; 
                break; 
            }
			Parse_StackFnPush( pStackFn, Hop_IthVar( pMan, v ) ); // Cudd_Ref( pbVars[v] );
            Flag = PARSE_EQN_FLAG_VAR; 
            break;
	    }

		if ( Flag == PARSE_EQN_FLAG_ERROR )
			break;      // error exit
		else if ( Flag == PARSE_EQN_FLAG_START )
			continue;  //  go on parsing
		else if ( Flag == PARSE_EQN_FLAG_VAR )
			while ( 1 )
			{  // check if there are negations in the OpStack     
				if ( Parse_StackOpIsEmpty(pStackOp) )
					break;
                Oper = Parse_StackOpPop( pStackOp );
				if ( Oper != PARSE_EQN_OPER_NEG )
                {
					Parse_StackOpPush( pStackOp, Oper );
					break;
                }
				else
				{
      				Parse_StackFnPush( pStackFn, Hop_Not((Hop_Obj_t *)Parse_StackFnPop(pStackFn)) );
				}
			}
		else // if ( Flag == PARSE_EQN_FLAG_OPER )
			while ( 1 )
			{  // execute all the operations in the OpStack
			   // with precedence higher or equal than the last one
				Oper1 = Parse_StackOpPop( pStackOp ); // the last operation
				if ( Parse_StackOpIsEmpty(pStackOp) ) 
				{  // if it is the only operation, push it back
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
				Oper2 = Parse_StackOpPop( pStackOp ); // the operation before the last one
				if ( Oper2 >= Oper1 )  
				{  // if Oper2 precedence is higher or equal, execute it
                    if ( Parse_ParserPerformTopOp( pMan, pStackFn, Oper2 ) == NULL )
	                {
		                fprintf( pOutput, "Parse_FormulaParserEqn(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Parse_StackFnFree( pStackFn );
                        Parse_StackOpFree( pStackOp );
		                return NULL;
	                }
					Parse_StackOpPush( pStackOp,  Oper1 );     // push the last operation back
				}
				else
				{  // if Oper2 precedence is lower, push them back and done
					Parse_StackOpPush( pStackOp, Oper2 );
					Parse_StackOpPush( pStackOp, Oper1 );
					break;
				}
			}
    }

	if ( Flag != PARSE_EQN_FLAG_ERROR )
    {
		if ( !Parse_StackFnIsEmpty(pStackFn) )
	    {	
			gFunc = (Hop_Obj_t *)Parse_StackFnPop(pStackFn);
			if ( Parse_StackFnIsEmpty(pStackFn) )
				if ( Parse_StackOpIsEmpty(pStackOp) )
                {
                    Parse_StackFnFree(pStackFn);
                    Parse_StackOpFree(pStackOp);
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
					return gFunc;
                }
				else
					fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the operation stack\n" );
			else
				fprintf( pOutput, "Parse_FormulaParserEqn(): Something is left in the function stack\n" );
	    }
	    else
			fprintf( pOutput, "Parse_FormulaParserEqn(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
	return NULL;
}